

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  ImGuiPopupData *pIVar2;
  ImGuiWindow *pIVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  bool bVar10;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar8 = (ulong)uVar1;
  if (uVar8 != 0) {
    uVar5 = 0;
    if (ref_window == (ImGuiWindow *)0x0) {
LAB_00112417:
      if ((int)uVar5 < (int)uVar1) {
        ClosePopupToLevel((int)uVar5,restore_focus_to_window_under_popup);
        return;
      }
    }
    else {
      uVar6 = 0;
      if (0 < (int)uVar1) {
        uVar6 = (ulong)uVar1;
      }
      lVar7 = 8;
      for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
        pIVar2 = (GImGui->OpenPopupStack).Data;
        pIVar3 = pIVar2[uVar5].Window;
        if ((pIVar3 != (ImGuiWindow *)0x0) && ((pIVar3->Flags & 0x1000000) == 0)) {
          plVar9 = (long *)((long)&pIVar2->PopupId + lVar7);
          uVar4 = uVar8;
          while( true ) {
            bVar10 = uVar4 == 0;
            uVar4 = uVar4 - 1;
            if (bVar10) goto LAB_00112417;
            if ((*plVar9 != 0) && (*(ImGuiWindow **)(*plVar9 + 0x390) == ref_window->RootWindow))
            break;
            plVar9 = plVar9 + 6;
          }
        }
        uVar8 = uVar8 - 1;
        lVar7 = lVar7 + 0x30;
      }
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}